

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindUnusedVariables::operator()(FindUnusedVariables *this,NewExpr *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_48;
  __shared_ptr *local_38;
  shared_ptr<mocker::ast::Expression> *dim;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  *__range2;
  NewExpr *node_local;
  FindUnusedVariables *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
           ::begin(&node->providedDims);
  dim = (shared_ptr<mocker::ast::Expression> *)
        std::
        vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
        ::end(&node->providedDims);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
                                     *)&dim), bVar1) {
    local_38 = (__shared_ptr *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
               ::operator*(&__end2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
                (&local_48,(shared_ptr<mocker::ast::Expression> *)local_38);
      visit(this,&local_48);
      std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_48);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void operator()(const ast::NewExpr &node) const override {
    for (auto &dim : node.providedDims)
      if (dim)
        visit(dim);
  }